

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v11::detail::bigint::assign_pow10(bigint *this,int exp)

{
  int iVar1;
  uint uVar2;
  
  if (exp < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format.h"
                ,0xa76,"");
  }
  if (exp != 0) {
    iVar1 = 0x1f;
    if (exp != 0) {
      for (; (uint)exp >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar2 = 1 << ((byte)iVar1 & 0x1f);
    *(this->bigits_).super_buffer<unsigned_int>.ptr_ = 5;
    if ((this->bigits_).super_buffer<unsigned_int>.capacity_ == 0) {
      (*(this->bigits_).super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)this,1);
    }
    (this->bigits_).super_buffer<unsigned_int>.size_ =
         (ulong)((this->bigits_).super_buffer<unsigned_int>.capacity_ != 0);
    this->exp_ = 0;
    if (iVar1 != 0) {
      do {
        uVar2 = (int)uVar2 >> 1;
        square(this);
        if ((uVar2 & exp) != 0) {
          multiply(this,5);
        }
      } while (1 < uVar2);
    }
    operator<<=(this,exp);
    return;
  }
  *(this->bigits_).super_buffer<unsigned_int>.ptr_ = 1;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ == 0) {
    (*(this->bigits_).super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)this,1);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ =
       (ulong)((this->bigits_).super_buffer<unsigned_int>.capacity_ != 0);
  this->exp_ = 0;
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign_pow10(int exp) {
    FMT_ASSERT(exp >= 0, "");
    if (exp == 0) return *this = 1;
    int bitmask = 1 << (num_bits<unsigned>() -
                        countl_zero(static_cast<uint32_t>(exp)) - 1);
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    *this = 5;
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }